

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

_Bool path_append(ecs_world_t *world,ecs_entity_t parent,ecs_entity_t child,ecs_entity_t component,
                 char *sep,char *prefix,ecs_strbuf_t *buf)

{
  _Bool _Var1;
  ecs_type_t type;
  ecs_entity_t child_00;
  char *__s;
  char buff [22];
  char local_48 [24];
  
  type = ecs_get_type(world,child);
  child_00 = ecs_find_in_type(world,type,component,0xfd00000000000000);
  if (child_00 == 0) {
    sep = prefix;
    if (prefix == (char *)0x0) goto LAB_0011306a;
  }
  else {
    if (child_00 == 0x118 || child_00 == parent) goto LAB_0011306a;
    path_append(world,parent,child_00,component,sep,prefix,buf);
  }
  ecs_strbuf_appendstr(buf,sep);
LAB_0011306a:
  __s = ecs_get_name(world,child);
  if (__s == (char *)0x0) {
    __s = local_48;
    sprintf(__s,"%u",child & 0xffffffff);
  }
  _Var1 = ecs_strbuf_appendstr(buf,__s);
  return _Var1;
}

Assistant:

static
bool path_append(
    ecs_world_t *world, 
    ecs_entity_t parent, 
    ecs_entity_t child, 
    ecs_entity_t component,
    const char *sep,
    const char *prefix,
    ecs_strbuf_t *buf)
{
    ecs_type_t type = ecs_get_type(world, child);
    ecs_entity_t cur = ecs_find_in_type(world, type, component, ECS_CHILDOF);
    
    if (cur) {
        if (cur != parent && cur != EcsFlecsCore) {
            path_append(world, parent, cur, component, sep, prefix, buf);
            ecs_strbuf_appendstr(buf, sep);
        }
    } else if (prefix) {
        ecs_strbuf_appendstr(buf, prefix);
    }

    char buff[22];
    const char *name = ecs_get_name(world, child);
    if (!name) {
        ecs_os_sprintf(buff, "%u", (uint32_t)child);
        name = buff;
    }

    ecs_strbuf_appendstr(buf, name);

    return cur != 0;
}